

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O2

bool __thiscall
gvr::MultiTexturedMesh::getUsedByTexture
          (MultiTexturedMesh *this,int t,vector<bool,_std::allocator<bool>_> *vused,
          vector<bool,_std::allocator<bool>_> *tused)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int *piVar4;
  int i;
  size_type sVar5;
  size_type __n;
  int i_1;
  long lVar6;
  reference rVar7;
  
  std::vector<bool,_std::allocator<bool>_>::resize
            (vused,(long)(this->super_Mesh).super_PointCloud.n,false);
  std::vector<bool,_std::allocator<bool>_>::resize(tused,(long)(this->super_Mesh).n,false);
  for (sVar5 = 0; (long)sVar5 < (long)(this->super_Mesh).super_PointCloud.n; sVar5 = sVar5 + 1) {
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](vused,sVar5);
    *rVar7._M_p = *rVar7._M_p & ~rVar7._M_mask;
  }
  for (sVar5 = 0; __n = (size_type)(this->super_Mesh).n, (long)sVar5 < (long)__n; sVar5 = sVar5 + 1)
  {
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](tused,sVar5);
    *rVar7._M_p = *rVar7._M_p & ~rVar7._M_mask;
  }
  bVar3 = false;
  do {
    piVar4 = &this->uvt[__n - 1].t;
    lVar2 = __n * 0xc;
    do {
      lVar6 = lVar2;
      if ((long)__n < 1) {
        return bVar3;
      }
      __n = __n - 1;
      iVar1 = *piVar4;
      piVar4 = piVar4 + -7;
      lVar2 = lVar6 + -0xc;
    } while (iVar1 != t);
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (vused,(ulong)*(uint *)((long)(this->super_Mesh).triangle + lVar6 + -0xc));
    *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (vused,(ulong)*(uint *)((long)(this->super_Mesh).triangle + lVar6 + -8));
    *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (vused,(ulong)*(uint *)((long)(this->super_Mesh).triangle + lVar6 + -4));
    *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](tused,__n);
    *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
    bVar3 = true;
  } while( true );
}

Assistant:

bool MultiTexturedMesh::getUsedByTexture(int t, std::vector<bool> &vused, std::vector<bool> &tused)
{
  vused.resize(getVertexCount());
  tused.resize(getTriangleCount());

  for (int i=0; i<getVertexCount(); i++)
  {
    vused[i]=false;
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    tused[i]=false;
  }

  bool ret=false;

  for (int i=getTriangleCount()-1; i>=0; i--)
  {
    if (getTextureIndex(i) == t)
    {
      vused[getTriangleIndex(i, 0)]=true;
      vused[getTriangleIndex(i, 1)]=true;
      vused[getTriangleIndex(i, 2)]=true;
      tused[i]=true;
      ret=true;
    }
  }

  return ret;
}